

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O2

istream * operator>>(istream *s,Am_Gesture_Trainer *tr)

{
  bool bVar1;
  istream *piVar2;
  Am_Gesture_Classifier_Data *cldata;
  Gesture_Class *pGVar3;
  istream *this;
  long *plVar4;
  Am_Wrapper *value;
  ostream *poVar5;
  char check;
  Am_Gesture_Trainer_Data *local_d0;
  Am_Gesture_Classifier cl;
  int y;
  int x;
  Am_Gesture_Trainer *local_b0;
  Am_String local_a8;
  Am_Feature_Vector fv;
  char buf [100];
  
  local_b0 = tr;
  Am_Gesture_Classifier::Am_Gesture_Classifier(&cl);
  piVar2 = operator>>(s,&cl);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    local_d0 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    cldata = (Am_Gesture_Classifier_Data *)Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(&cl);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(local_d0,cldata);
    bVar1 = Am_Gesture_Classifier::Trained(&cl);
    if (bVar1) {
      Am_Gesture_Classifier::operator=(&local_d0->cached_classifier,&cl);
    }
    else {
      Am_Gesture_Classifier::operator=
                (&local_d0->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
    }
    piVar2 = std::operator>>(s,&check);
    if (check == 'x' && ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      do {
        Am_Feature_Vector::Am_Feature_Vector(&fv);
        std::istream::get((char *)s,(long)buf);
        if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) != 0) {
LAB_001b1415:
          Am_Feature_Vector::~Am_Feature_Vector(&fv);
          poVar5 = std::operator<<((ostream *)&std::cerr,"unrecognized gesture classifier format");
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_001b143a;
        }
        Am_String::Am_String(&local_a8,buf,true);
        pGVar3 = Am_Gesture_Trainer_Data::Find_Class(local_d0,&local_a8);
        Am_String::~Am_String(&local_a8);
        if (pGVar3 == (Gesture_Class *)0x0) goto LAB_001b1415;
        while( true ) {
          this = (istream *)std::istream::operator>>((istream *)s,&x);
          plVar4 = (long *)std::istream::operator>>(this,&y);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
          Am_Feature_Vector::Add_Point(&fv,x,y);
        }
        std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
        value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(&fv);
        Am_Value_List::Add(&pGVar3->examples,value,Am_TAIL,true);
        Am_Feature_Vector::~Am_Feature_Vector(&fv);
        piVar2 = std::operator>>(s,&check);
      } while ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) &&
              (check == 'x'));
    }
    if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
      std::istream::putback((char)s);
    }
    if (local_b0->data != (Am_Gesture_Trainer_Data *)0x0) {
      Am_Wrapper::Release(&local_b0->data->super_Am_Wrapper);
    }
    local_b0->data = local_d0;
LAB_001b143a:
    std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
  }
  Am_Gesture_Classifier::~Am_Gesture_Classifier(&cl);
  return s;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Trainer &tr)
{
  // First read in a classifier (or an untrained classifier containing only
  // class names)
  Am_Gesture_Classifier cl;

  if (!(s >> cl))
    return s;

  Am_Gesture_Trainer_Data *trdata;
  Am_Gesture_Trainer_Data::Gesture_Class *cls = nullptr;
  char check;
  char buf[100];
  int x, y;

  // construct a new trainer by copying the classes in cl
  trdata = new Am_Gesture_Trainer_Data(
      (Am_Gesture_Classifier_Data *)(Am_Wrapper *)cl);

  if (cl.Trained())
    trdata->cached_classifier = cl;
  else
    trdata->cached_classifier = nullptr;

  // Now look for examples.  Examples have the check character 'x'.

  if ((s >> check) && check == 'x') {
    //AM_TRACE("Reading training examples\n");

    do {
      Am_Feature_Vector fv;

      // get the class name of this example
      s.get(buf, sizeof(buf));
      if (!s || (cls = trdata->Find_Class(buf)) == nullptr)
        goto LFail;

      // accumulate the points from this example
      while (s >> x >> y)
        fv.Add_Point(x, y);
      s.clear(std::ios::goodbit);

      cls->examples.Add(fv);

    } while ((s >> check) && check == 'x');
  }

  if (s)
    s.putback(check);

  // return the new trainer
  if (tr.data)
    tr.data->Release();
  tr.data = trdata;

  s.clear(std::ios::goodbit);
  return s;

LFail:
  static const char *bad_format = "unrecognized gesture classifier format";
  std::cerr << bad_format << std::endl;
  s.clear(std::ios::badbit);
  return s;
}